

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibrary::BindReference(JavascriptLibrary *this,void *addr)

{
  Type *addr_00;
  Type *addr_01;
  WriteBarrierPtr<void> *addr_02;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  WriteBarrierPtr<void> *pWVar5;
  Type *addr_03;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  addr_00 = &this->bindRefChunkCurrent;
  addr_01 = &this->bindRefChunkEnd;
  if ((this->bindRefChunkCurrent).ptr == (this->bindRefChunkEnd).ptr) {
    local_60 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 2;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1caa;
    data._32_8_ = addr;
    this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00c0461d;
      *puVar4 = 0;
    }
    pWVar5 = (WriteBarrierPtr<void> *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                       (this_00,0x10);
    if (pWVar5 == (WriteBarrierPtr<void> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00c0461d;
      *puVar4 = 0;
    }
    pWVar5->ptr = (void *)0x0;
    pWVar5[1].ptr = (void *)0x0;
    Memory::Recycler::WBSetBit((char *)addr_01);
    (this->bindRefChunkEnd).ptr = pWVar5 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
    if ((this->bindRefChunkBegin).ptr == (void *)0x0) {
      addr_03 = (Type *)&this->bindRefChunkBegin;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = pWVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      pWVar5 = addr_00->ptr;
      Memory::Recycler::WBSetBit((char *)addr_03);
      ((Type *)addr_03)->ptr = pWVar5;
    }
    else {
      addr_02 = addr_00->ptr;
      Memory::Recycler::WBSetBit((char *)addr_02);
      addr_02->ptr = pWVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = pWVar5;
      addr_03 = addr_00;
    }
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_03);
    addr = (void *)data._32_8_;
  }
  if (addr_01->ptr < addr_00->ptr + 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1cb8,"((bindRefChunkCurrent+1) <= bindRefChunkEnd)",
                                "(bindRefChunkCurrent+1) <= bindRefChunkEnd");
    if (!bVar2) {
LAB_00c0461d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pWVar5 = addr_00->ptr;
  Memory::Recycler::WBSetBit((char *)pWVar5);
  pWVar5->ptr = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar5);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator++
            ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)local_60,(int)addr_00);
  return;
}

Assistant:

void JavascriptLibrary::BindReference(void * addr)
    {
        // The last void* is the linklist connecting to next block.
        if (bindRefChunkCurrent == bindRefChunkEnd)
        {
            Field(void*)* tmpBindRefChunk = RecyclerNewArrayZ(recycler,
                Field(void*), HeapConstants::ObjectGranularity / sizeof(void *));
            // reserve the last void* as the linklist node.
            bindRefChunkEnd = tmpBindRefChunk + (HeapConstants::ObjectGranularity / sizeof(void *) -1 );
            if (bindRefChunkBegin == nullptr)
            {
                bindRefChunkCurrent = tmpBindRefChunk;
                bindRefChunkBegin = bindRefChunkCurrent;
            }
            else
            {
                *bindRefChunkCurrent = tmpBindRefChunk;
                bindRefChunkCurrent = tmpBindRefChunk;
            }
        }
        Assert((bindRefChunkCurrent+1) <= bindRefChunkEnd);
        *bindRefChunkCurrent = addr;
        bindRefChunkCurrent++;
    }